

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

void learn_brand_slay_helper
               (player *p,object *obj1,object *obj2,monster_conflict *mon,_Bool allow_off,
               _Bool allow_temp)

{
  brand_conflict *pbVar1;
  _Bool _Var2;
  monster_lore *lore;
  object *poVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t wVar7;
  slay_conflict *slay;
  byte bVar8;
  bool bVar9;
  int *local_40;
  
  lore = get_lore(mon->race);
  if (1 < z_info->brand_max) {
    uVar6 = 1;
    local_40 = &timed_effects[0].temp_brand;
    do {
      if ((obj1 == (object *)0x0) || (obj1->brands == (_Bool *)0x0)) {
        bVar8 = 0;
      }
      else {
        bVar8 = obj1->brands[uVar6];
      }
      if (((obj2 != (object *)0x0) && (obj2->brands != (_Bool *)0x0)) &&
         (obj2->brands[uVar6] != false)) {
        bVar8 = 1;
      }
      if ((allow_off) && ((p->body).count != 0)) {
        wVar7 = L'\0';
        do {
          poVar3 = slot_object(p,wVar7);
          if (((poVar3 != (object *)0x0) && (poVar3->brands != (_Bool *)0x0)) &&
             ((poVar3->brands[uVar6] == true &&
              ((_Var2 = tval_is_weapon(poVar3), !_Var2 && (_Var2 = tval_is_launcher(poVar3), !_Var2)
               ))))) {
            bVar8 = 1;
          }
          wVar7 = wVar7 + L'\x01';
        } while ((uint)wVar7 < (uint)(p->body).count);
      }
      pbVar1 = brands;
      if ((bVar8 & 1) == 0) {
        if (allow_temp) {
          bVar9 = true;
          uVar5 = 0;
          piVar4 = local_40;
          do {
            if ((uVar6 == (uint)*piVar4) && (p->timed[uVar5] != 0)) break;
            bVar9 = uVar5 < 0x34;
            uVar5 = uVar5 + 1;
            piVar4 = piVar4 + 0x1e;
          } while (uVar5 != 0x35);
          if (bVar9) goto LAB_001ae305;
        }
      }
      else {
LAB_001ae305:
        if ((brands[uVar6].resist_flag == 0) ||
           (_Var2 = flag_has_dbg(mon->race->flags,0xc,brands[uVar6].resist_flag,"mon->race->flags",
                                 "b->resist_flag"), !_Var2)) {
          if ((bVar8 & 1) != 0) {
            player_learn_brand(p,(wchar_t)uVar6);
          }
          if (pbVar1[uVar6].resist_flag != L'\0') {
            lore_learn_flag_if_visible(lore,(monster *)mon,pbVar1[uVar6].resist_flag);
          }
          wVar7 = pbVar1[uVar6].vuln_flag;
          if (wVar7 != L'\0') goto LAB_001ae3d7;
        }
        else {
          _Var2 = player_knows_brand(p,(wchar_t)uVar6);
          if (_Var2) {
            wVar7 = pbVar1[uVar6].resist_flag;
LAB_001ae3d7:
            lore_learn_flag_if_visible(lore,(monster *)mon,wVar7);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < z_info->brand_max);
  }
  if (1 < z_info->slay_max) {
    uVar6 = 1;
    local_40 = &timed_effects[0].temp_slay;
    do {
      if ((obj1 == (object *)0x0) || (obj1->slays == (_Bool *)0x0)) {
        bVar8 = 0;
      }
      else {
        bVar8 = obj1->slays[uVar6];
      }
      if (((obj2 != (object *)0x0) && (obj2->slays != (_Bool *)0x0)) &&
         (obj2->slays[uVar6] != false)) {
        bVar8 = 1;
      }
      if ((allow_off) && ((p->body).count != 0)) {
        wVar7 = L'\0';
        do {
          poVar3 = slot_object(p,wVar7);
          if (((poVar3 != (object *)0x0) && (poVar3->slays != (_Bool *)0x0)) &&
             ((poVar3->slays[uVar6] == true &&
              ((_Var2 = tval_is_weapon(poVar3), !_Var2 && (_Var2 = tval_is_launcher(poVar3), !_Var2)
               ))))) {
            bVar8 = 1;
          }
          wVar7 = wVar7 + L'\x01';
        } while ((uint)wVar7 < (uint)(p->body).count);
      }
      if ((bVar8 & 1) == 0) {
        if (allow_temp) {
          bVar9 = true;
          uVar5 = 0;
          piVar4 = local_40;
          do {
            if ((uVar6 == (uint)*piVar4) && (p->timed[uVar5] != 0)) break;
            bVar9 = uVar5 < 0x34;
            uVar5 = uVar5 + 1;
            piVar4 = piVar4 + 0x1e;
          } while (uVar5 != 0x35);
          if (bVar9) goto LAB_001ae4df;
        }
      }
      else {
LAB_001ae4df:
        slay = slays + uVar6;
        _Var2 = react_to_specific_slay(slay,mon);
        if (_Var2) {
          if (slay->race_flag != L'\0') {
            lore_learn_flag_if_visible(lore,(monster *)mon,slay->race_flag);
          }
          _Var2 = monster_is_visible((monster *)mon);
          if ((_Var2) && ((bVar8 & 1) != 0)) {
            player_learn_slay(p,(wchar_t)uVar6);
          }
        }
        else {
          _Var2 = player_knows_slay(p,(wchar_t)uVar6);
          if ((_Var2) && (slay->race_flag != L'\0')) {
            lore_learn_flag_if_visible(lore,(monster *)mon,slay->race_flag);
          }
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < z_info->slay_max);
  }
  return;
}

Assistant:

static void learn_brand_slay_helper(struct player *p, struct object *obj1,
		struct object *obj2, const struct monster *mon, bool allow_off,
		bool allow_temp)
{
	struct monster_lore *lore = get_lore(mon->race);
	int i;

	/* Handle brands. */
	for (i = 1; i < z_info->brand_max; i++) {
		int j;
		struct brand *b;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->brands && obj1->brands[i]) {
			learn = true;
		}
		if (obj2 && obj2->brands && obj2->brands[i]) {
			learn = true;
		}

		/* Check for an off-weapon brand. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->brands && obj->brands[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary brand (only relevant if the brand
		 * is not already present).
		 */
		if (!learn && !(allow_temp && player_has_temporary_brand(p, i))) {
			continue;
		}

		b = &brands[i];
		if (!b->resist_flag || !rf_has(mon->race->flags, b->resist_flag)) {
			/* Learn the brand */
			if (learn) {
				player_learn_brand(p, i);
			}

			/* Learn about the monster. */
			if (b->resist_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->resist_flag);
			}
			if (b->vuln_flag) {
				lore_learn_flag_if_visible(lore, mon,
					b->vuln_flag);
			}
		} else if (player_knows_brand(p, i)) {
			/* Learn about the monster. */
			lore_learn_flag_if_visible(lore, mon, b->resist_flag);
		}
	}

	/* Handle slays. */
	for (i = 1; i < z_info->slay_max; ++i) {
		int j;
		struct slay *s;
		bool learn = false;

		/* Check the objects directly involved. */
		if (obj1 && obj1->slays && obj1->slays[i]) {
			learn = true;
		}
		if (obj2 && obj2->slays && obj2->slays[i]) {
			learn = true;
		}

		/* Check for an off-weapon slay. */
		if (allow_off) {
			for (j = 0; j < p->body.count; ++j) {
				struct object *obj = slot_object(p, j);

				if (obj && obj->slays && obj->slays[i]
						&& !tval_is_weapon(obj)
						&& !tval_is_launcher(obj)) {
					learn = true;
				}
			}
		}

		/*
		 * Check for the temporary slay (only relevant if the slay
		 * is not already present.
		 */
		if (!learn && !(allow_temp && player_has_temporary_slay(p, i))) {
			continue;
		}

		s = &slays[i];
		if (react_to_specific_slay(s, mon)) {
			/* Learn about the monster. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
			if (monster_is_visible(mon)) {
				/* Learn the slay */
				if (learn) {
					player_learn_slay(p, i);
				}
			}
		} else if (player_knows_slay(p, i)) {
			/* Learn about unaffected monsters. */
			if (s->race_flag) {
				lore_learn_flag_if_visible(lore, mon,
					s->race_flag);
			}
		}
	}
}